

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O3

bool __thiscall cmSetPropertyCommand::HandleGlobalMode(cmSetPropertyCommand *this)

{
  size_t sVar1;
  cmake *this_00;
  char *pcVar2;
  pointer value;
  allocator local_41;
  string local_40;
  
  sVar1 = (this->Names)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 == 0) {
    this_00 = cmMakefile::GetCMakeInstance((this->super_cmCommand).Makefile);
    if (this->Remove == false) {
      value = (this->PropertyValue)._M_dataplus._M_p;
    }
    else {
      value = (char *)0x0;
    }
    pcVar2 = (this->PropertyName)._M_dataplus._M_p;
    if (this->AppendMode == true) {
      std::__cxx11::string::string((string *)&local_40,pcVar2,&local_41);
      pcVar2 = "";
      if (value != (char *)0x0) {
        pcVar2 = value;
      }
      cmake::AppendProperty(this_00,&local_40,pcVar2,this->AppendAsString);
    }
    else {
      std::__cxx11::string::string((string *)&local_40,pcVar2,&local_41);
      cmake::SetProperty(this_00,&local_40,value);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) goto LAB_003ee8ea;
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"given names for GLOBAL scope.","");
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p == &local_40.field_2) goto LAB_003ee8ea;
  }
  operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
LAB_003ee8ea:
  return sVar1 == 0;
}

Assistant:

bool cmSetPropertyCommand::HandleGlobalMode()
{
  if(!this->Names.empty())
    {
    this->SetError("given names for GLOBAL scope.");
    return false;
    }

  // Set or append the property.
  cmake* cm = this->Makefile->GetCMakeInstance();
  const char* name = this->PropertyName.c_str();
  const char *value = this->PropertyValue.c_str();
  if (this->Remove)
    {
    value = 0;
    }
  if(this->AppendMode)
    {
    cm->AppendProperty(name, value ? value : "", this->AppendAsString);
    }
  else
    {
    cm->SetProperty(name, value);
    }

  return true;
}